

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void __thiscall tlx::SpacingLogger::SpacingLogger(SpacingLogger *this)

{
  __pointer_type pLVar1;
  LoggerPrefixHook *prefix_hook;
  SpacingLogger *this_local;
  
  this->first_ = true;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->oss_);
  pLVar1 = std::atomic<tlx::LoggerPrefixHook_*>::load
                     ((atomic<tlx::LoggerPrefixHook_*> *)&s_logger_prefix_hook,memory_order_seq_cst)
  ;
  if (pLVar1 != (__pointer_type)0x0) {
    (*pLVar1->_vptr_LoggerPrefixHook[2])(pLVar1,&this->oss_);
  }
  return;
}

Assistant:

SpacingLogger::SpacingLogger() {
    LoggerPrefixHook* prefix_hook = s_logger_prefix_hook.load();
    if (prefix_hook)
        prefix_hook->add_log_prefix(oss_);
}